

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

RTFLOAT __thiscall RTMatrix4x4::matMinor(RTMatrix4x4 *this,int row,int col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  
  lVar17 = (long)(row * 3);
  lVar16 = (long)(col * 3);
  iVar10 = matMinor::map[lVar17];
  iVar11 = matMinor::map[lVar16];
  fVar1 = this->m_data[iVar10][iVar11];
  iVar12 = matMinor::map[lVar17 + 1];
  iVar13 = matMinor::map[lVar16 + 1];
  fVar2 = this->m_data[iVar12][iVar13];
  iVar14 = matMinor::map[lVar17 + 2];
  iVar15 = matMinor::map[lVar16 + 2];
  fVar3 = this->m_data[iVar14][iVar15];
  fVar4 = this->m_data[iVar12][iVar15];
  fVar5 = this->m_data[iVar14][iVar13];
  fVar6 = this->m_data[iVar10][iVar13];
  fVar7 = this->m_data[iVar12][iVar11];
  fVar8 = this->m_data[iVar14][iVar11];
  fVar9 = this->m_data[iVar10][iVar15];
  return (fVar7 * fVar9 * fVar5 +
         fVar4 * fVar6 * fVar8 +
         (((fVar1 * fVar2 * fVar3 + 0.0) - fVar1 * fVar4 * fVar5) - fVar7 * fVar6 * fVar3)) -
         fVar2 * fVar9 * fVar8;
}

Assistant:

RTFLOAT RTMatrix4x4::matMinor(const int row, const int col)
{
    static int map[] = {1, 2, 3, 0, 2, 3, 0, 1, 3, 0, 1, 2};

    int *rc;
    int *cc;
    RTFLOAT res = 0;

    rc = map + row * 3;
    cc = map + col * 3;

    res += m_data[rc[0]][cc[0]] * m_data[rc[1]][cc[1]] * m_data[rc[2]][cc[2]];
    res -= m_data[rc[0]][cc[0]] * m_data[rc[1]][cc[2]] * m_data[rc[2]][cc[1]];
    res -= m_data[rc[0]][cc[1]] * m_data[rc[1]][cc[0]] * m_data[rc[2]][cc[2]];
    res += m_data[rc[0]][cc[1]] * m_data[rc[1]][cc[2]] * m_data[rc[2]][cc[0]];
    res += m_data[rc[0]][cc[2]] * m_data[rc[1]][cc[0]] * m_data[rc[2]][cc[1]];
    res -= m_data[rc[0]][cc[2]] * m_data[rc[1]][cc[1]] * m_data[rc[2]][cc[0]];
    return res;
}